

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O0

unsigned_long dlib::impl::default_num_threads(void)

{
  uint uVar1;
  char *pcVar2;
  string_cast_error *anon_var_0;
  char *nt;
  unsigned_long local_8;
  
  pcVar2 = getenv("DLIB_NUM_THREADS");
  if (pcVar2 == (char *)0x0) {
    uVar1 = std::thread::hardware_concurrency();
    local_8 = (unsigned_long)uVar1;
  }
  else {
    local_8 = string_cast<unsigned_long>((char *)anon_var_0);
  }
  return local_8;
}

Assistant:

unsigned long default_num_threads()
        {
            try
            {
                char* nt = getenv("DLIB_NUM_THREADS");
                if (nt)
                    return string_cast<unsigned long>(nt);
            } catch(string_cast_error&) {}
            return std::thread::hardware_concurrency();
        }